

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

UBool icu_63::isAvailableLocaleListInitialized(UErrorCode *status)

{
  umtx_initOnce(&gAvailableLocaleListInitOnce,initAvailableLocaleList,status);
  return *status < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool isAvailableLocaleListInitialized(UErrorCode &status) {
    umtx_initOnce(gAvailableLocaleListInitOnce, &initAvailableLocaleList, status);
    return U_SUCCESS(status);
}